

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::normalize
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this)

{
  byte bVar1;
  uint uVar2;
  spectral_operation sVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var4;
  reference puVar5;
  anon_class_8_1_8991fb9c_for__M_comp in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false,_false>,_bool>
  pVar6;
  bool result;
  uint v;
  uint p;
  uint k;
  uint j;
  unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
  *in_stack_ffffffffffffff48;
  pair<const_unsigned_long,_kitty::detail::spectrum> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  _Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>
  in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  _Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>
  in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  pair<const_unsigned_long,_kitty::detail::spectrum> local_68;
  uint local_48;
  undefined4 local_44;
  uint16_t local_40;
  undefined4 local_3e;
  uint16_t local_3a;
  uint local_38;
  uint local_34;
  uint *local_28;
  uint *local_20;
  uint v_00;
  undefined4 in_stack_fffffffffffffff0;
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this_00;
  
  this_00 = in_RDI.this;
  local_20 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff48);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_ffffffffffffff48);
  _Var4._M_current._4_4_ = in_stack_ffffffffffffff74;
  _Var4._M_current._0_4_ = in_stack_ffffffffffffff70;
  _Var4 = std::
          max_element<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::normalize()::_lambda(auto:1,auto:2)_1_>
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )in_stack_ffffffffffffff78._M_cur,_Var4,in_RDI);
  puVar5 = __gnu_cxx::
           __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&stack0xffffffffffffffe8);
  uVar2 = *puVar5;
  if (uVar2 != 0) {
    local_34 = uVar2 - (uVar2 & uVar2 - 1);
    uVar2 = local_34 ^ uVar2;
    while (uVar2 != 0) {
      local_38 = uVar2 & -uVar2;
      uVar2 = uVar2 ^ local_38;
      sVar3 = spectrum::spectral_translation
                        ((spectrum *)in_stack_ffffffffffffff78._M_cur,in_stack_ffffffffffffff74,
                         in_stack_ffffffffffffff70);
      local_3e = sVar3._0_4_;
      local_3a = sVar3._var2;
      insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (spectral_operation *)in_RDI.this);
    }
    if (((in_RDI.this)->hasDisjointTranslation & 1U) != 0) {
      sVar3 = spectrum::disjoint_translation
                        ((spectrum *)in_RDI.this,
                         (int)((ulong)in_stack_ffffffffffffff60._M_cur >> 0x20));
      local_44 = sVar3._0_4_;
      local_40 = sVar3._var2;
      insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (spectral_operation *)in_RDI.this);
    }
  }
  for (local_48 = 1; v_00 = (uint)((ulong)_Var4._M_current >> 0x20),
      local_48 <= (in_RDI.this)->num_vars_exp; local_48 = local_48 << 1) {
    in_stack_ffffffffffffff48 = &(in_RDI.this)->specs;
    in_stack_ffffffffffffff50 = &local_68;
    std::pair<const_unsigned_long,_kitty::detail::spectrum>::
    pair<unsigned_int_&,_kitty::detail::spectrum_&,_true>
              (in_stack_ffffffffffffff50,(uint *)in_stack_ffffffffffffff48,(spectrum *)0x12036a);
    pVar6 = std::
            unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
            ::insert((unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
                      *)in_stack_ffffffffffffff60._M_cur,
                     (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff60._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_kitty::detail::spectrum>,_false>.
         _M_cur;
    in_stack_ffffffffffffff5f = pVar6.second;
    in_stack_ffffffffffffff78._M_cur = in_stack_ffffffffffffff60._M_cur;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff5f;
    std::pair<const_unsigned_long,_kitty::detail::spectrum>::~pair
              ((pair<const_unsigned_long,_kitty::detail::spectrum> *)0x12039f);
  }
  update_best((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
              CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),
              (spectrum *)in_stack_ffffffffffffff78._M_cur);
  bVar1 = normalize_rec(this_00,(spectrum *)CONCAT44(uVar2,in_stack_fffffffffffffff0),v_00);
  spectrum::operator=((spectrum *)in_stack_ffffffffffffff50,(spectrum *)in_stack_ffffffffffffff48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool normalize()
  {
    /* find maximum absolute element index in spectrum (by order) */
    auto j = *std::max_element( order.cbegin(), order.cend(), [this]( auto p1, auto p2 )
                                { return abs( spec[p1] ) < abs( spec[p2] ); } );

    /* if max element is not the first element */
    if ( j )
    {
      auto k = j - ( j & ( j - 1 ) ); /* LSB of j */
      j ^= k;                         /* delete bit in j */

      while ( j )
      {
        auto p = j - ( j & ( j - 1 ) ); /* next LSB of j */
        j ^= p;                         /* delete bit in j */
        insert( spec.spectral_translation( k, p ) );
      }
      if ( hasDisjointTranslation )
      {
        insert( spec.disjoint_translation( k ) );
      }
    }

    for ( auto v = 1u; v <= num_vars_exp; v <<= 1 )
    {
      specs.insert( { v, spec } );
    }

    update_best( spec );
    const auto result = normalize_rec( spec, 1 );
    spec = best_spec;
    return result;
  }